

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_runner.cpp
# Opt level: O1

void __thiscall duckdb::SQLLogicTestRunner::Reconnect(SQLLogicTestRunner *this)

{
  unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  type pDVar2;
  Connection *this_01;
  long *plVar3;
  pointer this_02;
  type pCVar4;
  long lVar5;
  size_type *psVar6;
  long *plVar7;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  res1;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  pDVar2 = unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>::operator*
                     (&this->db);
  this_01 = (Connection *)operator_new(0x20);
  duckdb::Connection::Connection(this_01,pDVar2);
  this_00 = &this->con;
  std::__uniq_ptr_impl<duckdb::Connection,_std::default_delete<duckdb::Connection>_>::reset
            ((__uniq_ptr_impl<duckdb::Connection,_std::default_delete<duckdb::Connection>_> *)
             this_00,this_01);
  if (this->original_sqlite_test == true) {
    unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::operator->
              (this_00);
    local_c0 = &local_b0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"SET integer_division=true","");
    duckdb::Connection::Query((string *)&local_98);
    if (local_98 != (long *)0x0) {
      (**(code **)(*local_98 + 8))();
    }
    local_98 = (long *)0x0;
    if (local_c0 != &local_b0) {
      operator_delete(local_c0);
    }
  }
  unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::operator->(this_00)
  ;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"test_secret_dir","");
  TestCreatePath(&local_70,&local_50);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x4eecf7);
  paVar1 = &local_90.field_2;
  psVar6 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_90.field_2._M_allocated_capacity = *psVar6;
    local_90.field_2._8_8_ = plVar3[3];
    local_90._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar6;
    local_90._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_90._M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_b0 = *plVar7;
    lStack_a8 = plVar3[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar7;
    local_c0 = (long *)*plVar3;
  }
  local_b8 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  duckdb::Connection::Query((string *)&local_a0);
  if (local_a0 != (long *)0x0) {
    (**(code **)(*local_a0 + 8))();
  }
  local_a0 = (long *)0x0;
  if (local_c0 != &local_b0) {
    operator_delete(local_c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  this_02 = unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
            operator->(this_00);
  pCVar4 = shared_ptr<duckdb::ClientContext,_true>::operator*
                     ((shared_ptr<duckdb::ClientContext,_true> *)this_02);
  lVar5 = duckdb::ClientConfig::GetConfig(pCVar4);
  *(undefined2 *)(lVar5 + 0x90) = 1;
  if (this->enable_verification == true) {
    unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::operator->
              (this_00);
    duckdb::Connection::EnableQueryVerification();
  }
  if ((this->local_extension_repo)._M_string_length != 0) {
    unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::operator->
              (this_00);
    std::operator+(&local_90,"SET autoinstall_extension_repository=\'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &this->local_extension_repo);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_b0 = *plVar7;
      lStack_a8 = plVar3[3];
      local_c0 = &local_b0;
    }
    else {
      local_b0 = *plVar7;
      local_c0 = (long *)*plVar3;
    }
    local_b8 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    duckdb::Connection::Query((string *)&local_70);
    if (local_c0 != &local_b0) {
      operator_delete(local_c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
    }
  }
  return;
}

Assistant:

void SQLLogicTestRunner::Reconnect() {
	con = make_uniq<Connection>(*db);
	if (original_sqlite_test) {
		con->Query("SET integer_division=true");
	}
	con->Query("SET secret_directory='" + TestCreatePath("test_secret_dir") + "'");
#ifdef DUCKDB_ALTERNATIVE_VERIFY
	con->Query("SET pivot_filter_threshold=0");
#endif
	auto &client_config = ClientConfig::GetConfig(*con->context);
	client_config.enable_progress_bar = true;
	client_config.print_progress_bar = false;
	if (enable_verification) {
		con->EnableQueryVerification();
	}
	// Set the local extension repo for autoinstalling extensions
	if (!local_extension_repo.empty()) {
		auto res1 = con->Query("SET autoinstall_extension_repository='" + local_extension_repo + "'");
	}
}